

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::PutSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  long lVar1;
  int64_t iVar2;
  ostream *this_00;
  int64_t iVar3;
  TPZBaseMatrix *in_RCX;
  Fad<double> *in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  int64_t minCol;
  int64_t minRow;
  size_t in_stack_00000358;
  char *in_stack_00000360;
  Fad<double> *this_01;
  int64_t local_b0;
  int64_t local_a0;
  undefined1 local_70 [32];
  long local_50;
  Fad<double> *local_48;
  long local_40;
  long local_38;
  int64_t local_30;
  int64_t local_28;
  TPZBaseMatrix *local_20;
  Fad<double> *local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 <= in_RSI) {
    this_00 = std::operator<<((ostream *)&std::cout,"incompatible dimensions");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000360,in_stack_00000358);
  }
  iVar2 = TPZBaseMatrix::Rows(local_20);
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 < iVar3 - local_10) {
    local_a0 = TPZBaseMatrix::Rows(local_20);
  }
  else {
    local_a0 = TPZBaseMatrix::Rows(in_RDI);
    local_a0 = local_a0 - local_10;
  }
  local_28 = local_a0;
  iVar2 = TPZBaseMatrix::Cols(local_20);
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar2 < iVar3 - (long)local_18) {
    local_b0 = TPZBaseMatrix::Cols(local_20);
  }
  else {
    local_b0 = TPZBaseMatrix::Cols(in_RDI);
    local_b0 = local_b0 - (long)local_18;
  }
  local_30 = local_b0;
  local_38 = local_10;
  for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
    local_48 = local_18;
    for (local_50 = 0; lVar1 = local_38, local_50 < local_30; local_50 = local_50 + 1) {
      this_01 = local_48;
      (*(local_20->super_TPZSavable)._vptr_TPZSavable[0x24])(local_70,local_20,local_40,local_50);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,this_01,local_70);
      Fad<double>::~Fad(this_01);
      local_48 = (Fad<double> *)((long)&local_48->val_ + 1);
    }
    local_38 = local_38 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::PutSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
    if(sRow >= this->Rows()){
        LOGPZ_ERROR(logger,"incompatible dimensions")
        DebugStop();
    }

    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	
    int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, A.GetVal( r, c ) );
        }
    }
    return( 1 );
}